

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O3

void __thiscall asl::CmdArgs::parse(CmdArgs *this,int argc,char **argv,String *spec)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  Array<asl::String> *this_00;
  String *this_01;
  String *pSVar8;
  ulong uVar9;
  anon_union_16_2_78e7fdac_for_String_2 *paVar10;
  ulong uVar11;
  long lVar12;
  String opt;
  Array<asl::String> options;
  Array<asl::String> flags;
  Array<asl::String> parts;
  String local_80;
  Array<asl::String> local_68;
  Array<asl::String> local_60;
  String local_58;
  Dic<asl::Array<asl::String>_> *local_40;
  Array<asl::String> *local_38;
  
  if (argc != 0) {
    uVar11 = (ulong)(uint)-argc;
    if (0 < argc) {
      uVar11 = (ulong)(uint)argc;
    }
    uVar9 = 0;
    do {
      String::String(&local_80,argv[uVar9]);
      Array<asl::String>::insert(&this->_args,-1,&local_80);
      if (local_80._size != 0) {
        free((void *)CONCAT62(local_80.field_2._2_6_,local_80.field_2._0_2_));
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  Array<asl::String>::alloc(&local_60,0);
  Array<asl::String>::alloc(&local_68,0);
  local_80._size = 0;
  local_80._len = 1;
  local_80.field_2._0_2_ = 0x2c;
  String::split(&local_58,spec);
  if (local_80._size != 0) {
    free((void *)CONCAT62(local_80.field_2._2_6_,local_80.field_2._0_2_));
  }
  if (0 < (long)*(int *)(local_58._0_8_ + -0x10)) {
    uVar11 = (long)*(int *)(local_58._0_8_ + -0x10) << 0x20;
    do {
      pSVar8 = (String *)(local_58._0_8_ + (long)(int)uVar11 * 0x18);
      iVar5 = String::indexOf(pSVar8,':',0);
      if (iVar5 < 0) {
        Array<asl::String>::insert(&local_60,-1,pSVar8);
      }
      else {
        iVar5 = String::indexOf(pSVar8,':',0);
        String::substring(&local_80,pSVar8,0,iVar5);
        Array<asl::String>::insert(&local_68,-1,&local_80);
        if (local_80._size != 0) {
          free((void *)CONCAT62(local_80.field_2._2_6_,local_80.field_2._0_2_));
        }
      }
      uVar9 = uVar11 + 1;
      uVar2 = uVar11 >> 0x20;
      uVar11 = uVar11 & 0xffffffff00000000 | uVar9 & 0xffffffff;
    } while ((int)uVar9 < (int)uVar2);
  }
  pSVar8 = (this->_args)._a;
  if (1 < *(int *)&pSVar8[-1].field_2) {
    local_38 = &this->_rest;
    local_58.field_2._8_8_ = &this->_unused;
    local_40 = &this->_multi;
    local_58.field_2._str = (char *)&this->_opts;
    iVar5 = 1;
    do {
      paVar10 = &pSVar8[iVar5].field_2;
      iVar6 = pSVar8[iVar5]._size;
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)paVar10->_str;
      if (iVar6 != 0) {
        paVar10 = paVar7;
      }
      if ((paVar10->_space[0] == '-') &&
         (((byte)(paVar10->_space[1] - 0x30U) < 10 ||
          ((byte)((paVar10->_space[1] & 0xdfU) + 0xbf) < 0x1a)))) {
LAB_0013c990:
        pSVar8 = pSVar8 + iVar5;
        iVar1 = pSVar8->_len;
        if ((long)iVar1 < 1) {
          bVar3 = false;
        }
        else {
          if (iVar6 == 0) {
            paVar7 = &pSVar8->field_2;
          }
          bVar3 = paVar7->_space[(long)iVar1 + -1] == '!';
        }
        String::substring(&local_80,pSVar8,1,iVar1 - (uint)bVar3);
        bVar4 = Array<asl::String>::contains((Array<asl::String> *)local_58.field_2._8_8_,&local_80)
        ;
        if (!bVar4) {
          Array<asl::String>::insert((Array<asl::String> *)local_58.field_2._8_8_,-1,&local_80);
        }
        pSVar8 = (this->_args)._a;
        if (iVar5 < *(int *)&pSVar8[-1].field_2 + -1) {
          iVar6 = iVar5 + 1;
          if (pSVar8[iVar6]._size == 0) {
            paVar7 = &pSVar8[iVar6].field_2;
          }
          else {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar8[iVar6].field_2._str;
          }
          if ((paVar7->_space[0] != '-') || (0x19 < (byte)((paVar7->_space[1] & 0xdfU) + 0xbf))) {
            bVar4 = String::startsWith(pSVar8 + iVar6,"--");
            pSVar8 = (this->_args)._a;
            if (!bVar4) goto LAB_0013ca72;
            if (pSVar8[iVar6]._size == 0) {
              paVar7 = &pSVar8[iVar6].field_2;
            }
            else {
              paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar8[iVar6].field_2._str;
            }
            bVar4 = (byte)((paVar7->_space[2] & 0xdfU) + 0xbf) < 0x1a;
            goto LAB_0013ca8a;
          }
LAB_0013cb33:
          if ((bVar3 == false) && (iVar6 = *(int *)&local_68._a[-1].field_2, 0 < (long)iVar6)) {
            lVar12 = 0;
            do {
              bVar3 = String::operator==((String *)((long)&(local_68._a)->_size + lVar12),&local_80)
              ;
              if (bVar3) {
                bVar3 = false;
                goto LAB_0013cb92;
              }
              lVar12 = lVar12 + 0x18;
            } while ((long)iVar6 * 0x18 != lVar12);
          }
LAB_0013cb6e:
          pSVar8 = Map<asl::String,_asl::String>::operator[]
                             ((Map<asl::String,_asl::String> *)local_58.field_2._str,&local_80);
          bVar3 = true;
          String::assign(pSVar8,"1",1);
        }
        else {
LAB_0013ca72:
          bVar4 = false;
LAB_0013ca8a:
          if ((bVar4) || (*(int *)&pSVar8[-1].field_2 + -1 <= iVar5)) goto LAB_0013cb33;
          iVar6 = *(int *)&local_60._a[-1].field_2;
          if (0 < (long)iVar6) {
            lVar12 = 0;
            do {
              bVar4 = String::operator==((String *)((long)&(local_60._a)->_size + lVar12),&local_80)
              ;
              if (bVar4) goto LAB_0013cb33;
              lVar12 = lVar12 + 0x18;
            } while ((long)iVar6 * 0x18 != lVar12);
          }
          if (bVar3 != false) goto LAB_0013cb6e;
          this_00 = Map<asl::String,_asl::Array<asl::String>_>::operator[]
                              (&local_40->super_Map<asl::String,_asl::Array<asl::String>_>,&local_80
                              );
          iVar5 = iVar5 + 1;
          Array<asl::String>::insert(this_00,-1,(this->_args)._a + iVar5);
          pSVar8 = (this->_args)._a;
          this_01 = Map<asl::String,_asl::String>::operator[]
                              ((Map<asl::String,_asl::String> *)local_58.field_2._str,&local_80);
          if (pSVar8[iVar5]._size == 0) {
            paVar7 = &pSVar8[iVar5].field_2;
          }
          else {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)pSVar8[iVar5].field_2._str;
          }
          bVar3 = true;
          String::assign(this_01,paVar7->_space,pSVar8[iVar5]._len);
        }
LAB_0013cb92:
        if (local_80._size != 0) {
          free((void *)CONCAT62(local_80.field_2._2_6_,local_80.field_2._0_2_));
        }
        if (!bVar3) break;
      }
      else {
        bVar3 = String::startsWith(pSVar8 + iVar5,"--");
        pSVar8 = (this->_args)._a;
        if (bVar3) {
          paVar10 = &pSVar8[iVar5].field_2;
          iVar6 = pSVar8[iVar5]._size;
          paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)paVar10->_str;
          if (iVar6 != 0) {
            paVar10 = paVar7;
          }
          if (((byte)(paVar10->_space[2] - 0x30U) < 10) ||
             ((byte)((paVar10->_space[2] & 0xdfU) + 0xbf) < 0x1a)) goto LAB_0013c990;
        }
        pSVar8 = pSVar8 + iVar5;
        if (pSVar8->_len == 1) {
          if (pSVar8->_size == 0) {
            paVar7 = &pSVar8->field_2;
          }
          else {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar8->field_2)._str;
          }
          if (paVar7->_space[0] != '-') goto LAB_0013ca1d;
        }
        else {
LAB_0013ca1d:
          Array<asl::String>::insert(local_38,-1,pSVar8);
        }
      }
      iVar5 = iVar5 + 1;
      pSVar8 = (this->_args)._a;
    } while (iVar5 < *(int *)&pSVar8[-1].field_2);
  }
  Array<asl::String>::~Array((Array<asl::String> *)&local_58);
  Array<asl::String>::~Array(&local_68);
  Array<asl::String>::~Array(&local_60);
  return;
}

Assistant:

void CmdArgs::parse(int argc, char* argv[], const String& spec)
{
	int n = abs(argc);
	for (int i = 0; i < n; i++)
	{
#ifdef _WIN32
		_args << ((argc < 0) ? String(argv[i]) : String::fromLocal(argv[i]));
#else
		_args << argv[i];
#endif
	}
	Array<String> flags;
	Array<String> options;
	Array<String> parts = spec.split(',');
	foreach(const String & s, parts)
	{
		if (s.contains(':'))
			options << s.substring(0, s.indexOf(':'));
		else
			flags << s;
	}
	for (int i = 1; i < _args.length(); i++)
	{
		if ((_args[i].startsWith('-') && myisalnum(_args[i][1])) || (_args[i].startsWith("--") && myisalnum(_args[i][2])))
		{
			bool isflag = _args[i].endsWith('!');
			String opt = _args[i].substring(1, _args[i].length() - (isflag ? 1 : 0));
			if (!_unused.contains(opt))
				_unused << opt;
			bool nextIsOption = i < _args.length() - 1 && ((_args[i + 1].startsWith('-') && myisalpha(_args[i + 1][1])) || (_args[i + 1].startsWith("--") && myisalpha(_args[i + 1][2])));
			if ((i < _args.length() - 1 && !nextIsOption) && !flags.contains(opt) && !isflag)
			{
				_multi[opt] << _args[i + 1];
				_opts[opt] = _args[i + 1];
				i++;
			}
			else if (isflag || !options.contains(opt))
			{
				_opts[opt] = "1";
			}
			else // option without value!
				return;
		}
		else if (_args[i] != '-')
			_rest << _args[i];
	}
}